

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerializer.cpp
# Opt level: O3

void __thiscall SimpleSerializer::Serialize(SimpleSerializer *this,IObject *pObject)

{
  iterator iVar1;
  ObjectId ownerId;
  key_type local_28;
  
  if (pObject == (IObject *)0x0) {
    __assert_fail("pObject",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/RuntimeCompiledCPlusPlus/Aurora/RuntimeObjectSystem/SimpleSerializer/SimpleSerializer.cpp"
                  ,0x50,"void SimpleSerializer::Serialize(IObject *)");
  }
  if (this->m_pCurrentObject == (IObject *)0x0) {
    this->m_pCurrentObject = pObject;
    local_28.m_PerTypeId._0_4_ = 0xffffffff;
    local_28.m_PerTypeId._4_4_ = 0xffffffff;
    local_28.m_ConstructorId._0_4_ = 0xffffffff;
    local_28.m_ConstructorId._4_4_ = 0xffffffff;
    (**(code **)(*(long *)pObject + 0x28))(pObject,&local_28);
    iVar1 = std::
            _Rb_tree<ObjectId,_std::pair<const_ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>_>,_std::_Select1st<std::pair<const_ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>_>_>,_std::less<ObjectId>,_std::allocator<std::pair<const_ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>_>_>_>
            ::find(&(this->m_map)._M_t,&local_28);
    (this->m_CurrentSerialization)._M_node = iVar1._M_node;
    (**(code **)(*(long *)this->m_pCurrentObject + 0x40))(this->m_pCurrentObject,this);
    this->m_pCurrentObject = (IObject *)0x0;
    return;
  }
  __assert_fail("0 == m_pCurrentObject",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/RuntimeCompiledCPlusPlus/Aurora/RuntimeObjectSystem/SimpleSerializer/SimpleSerializer.cpp"
                ,0x51,"void SimpleSerializer::Serialize(IObject *)");
}

Assistant:

void SimpleSerializer::Serialize( IObject* pObject )
{
	assert( pObject );
	assert( 0 == m_pCurrentObject );	//should not serialize an object from within another

	m_pCurrentObject = pObject;
	ObjectId ownerId;
	m_pCurrentObject->GetObjectId(ownerId);

//	gSys->pLogSystem->Log( eLV_COMMENTS, "SimpleSerialiser: Serialising %s object: objectIdtype \"%s\", perTypeID:%d, address:0x%p\n"
//			, m_bLoading ? "in" : "out", pObject->GetTypeName(), ownerId.m_PerTypeId, pObject );

	m_CurrentSerialization = m_map.find(ownerId);

	m_pCurrentObject->Serialize( this );

	//reset m_pCurrentObject
	m_pCurrentObject = 0;
}